

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O1

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_unary_expression_t *expr)

{
  unary_operator_t uVar1;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_60;
  string local_40;
  
  uVar1 = (expr->super_unary_expression_t)._operator;
  if (uVar1 == EXPR_OP_LNOT) {
    if ((expr->super_typed_expression_t)._type == EXPR_TYPE_ATOMIC_PREDICATE) goto LAB_0014ccc2;
    paVar3 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"an unary expression","");
    invalid_expression(this,&expr->super_typed_expression_t,&local_60);
    _Var2._M_p = local_60._M_dataplus._M_p;
  }
  else {
    if ((uVar1 != EXPR_OP_NEG) || ((expr->super_typed_expression_t)._type == EXPR_TYPE_INTTERM))
    goto LAB_0014ccc2;
    paVar3 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"an unary expression","");
    invalid_expression(this,&expr->super_typed_expression_t,&local_40);
    _Var2._M_p = local_40._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
  }
LAB_0014ccc2:
  compile_unary_expression(this,expr);
  return;
}

Assistant:

virtual void visit(tchecker::typed_unary_expression_t const & expr)
  {
    // NEG expresison
    if (expr.unary_operator() == tchecker::EXPR_OP_NEG) {
      if (expr.type() != tchecker::EXPR_TYPE_INTTERM)
        invalid_expression(expr, "an unary expression");
    }
    // LNOT expression
    else if (expr.unary_operator() == tchecker::EXPR_OP_LNOT) {
      if (expr.type() != tchecker::EXPR_TYPE_ATOMIC_PREDICATE)
        invalid_expression(expr, "an unary expression");
    }

    compile_unary_expression(expr);
  }